

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.h
# Opt level: O2

string * __thiscall
cmExtraSublimeTextGenerator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this)

{
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetName() const
                        { return cmExtraSublimeTextGenerator::GetActualName();}